

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_FakeMessageSet_Item_UnknownGroup *
upb_test_FakeMessageSet_Item_unknowngroup(upb_test_FakeMessageSet_Item *msg)

{
  bool bVar1;
  upb_test_FakeMessageSet_Item_UnknownGroup *ret;
  upb_test_FakeMessageSet_Item_UnknownGroup *default_val;
  upb_MiniTableField field;
  upb_test_FakeMessageSet_Item_UnknownGroup *local_28;
  upb_test_FakeMessageSet_Item_UnknownGroup *local_20;
  upb_MiniTableField local_18;
  
  local_20 = (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0;
  local_18.number_dont_copy_me__upb_internal_use_only = 8;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x40;
  local_18.presence = 0x46;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\n';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc2;
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,&local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,&local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28;
}

Assistant:

UPB_INLINE const upb_test_FakeMessageSet_Item_UnknownGroup* upb_test_FakeMessageSet_Item_unknowngroup(const upb_test_FakeMessageSet_Item* msg) {
  const upb_test_FakeMessageSet_Item_UnknownGroup* default_val = NULL;
  const upb_test_FakeMessageSet_Item_UnknownGroup* ret;
  const upb_MiniTableField field = {8, UPB_SIZE(24, 64), 70, 0, 10, (int)kUpb_FieldMode_Scalar | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init);
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}